

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyhanabi.cc
# Opt level: O0

void NewState(pyhanabi_game_t *game,pyhanabi_state_t *state)

{
  void *pvVar1;
  undefined8 *in_RSI;
  long *in_RDI;
  int in_stack_00000094;
  HanabiGame *in_stack_00000098;
  HanabiState *in_stack_000000a0;
  
  if (in_RSI == (undefined8 *)0x0) {
    __assert_fail("state != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Farama-Foundation[P]hanabi-learning-environment/hanabi_learning_environment/pyhanabi.cc"
                  ,0x124,"void NewState(pyhanabi_game_t *, pyhanabi_state_t *)");
  }
  if (in_RDI != (long *)0x0) {
    if (*in_RDI != 0) {
      pvVar1 = operator_new(0xa0);
      hanabi_learning_env::HanabiState::HanabiState
                (in_stack_000000a0,in_stack_00000098,in_stack_00000094);
      *in_RSI = pvVar1;
      return;
    }
    __assert_fail("game->game != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Farama-Foundation[P]hanabi-learning-environment/hanabi_learning_environment/pyhanabi.cc"
                  ,0x126,"void NewState(pyhanabi_game_t *, pyhanabi_state_t *)");
  }
  __assert_fail("game != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Farama-Foundation[P]hanabi-learning-environment/hanabi_learning_environment/pyhanabi.cc"
                ,0x125,"void NewState(pyhanabi_game_t *, pyhanabi_state_t *)");
}

Assistant:

void NewState(pyhanabi_game_t* game, pyhanabi_state_t* state) {
  REQUIRE(state != nullptr);
  REQUIRE(game != nullptr);
  REQUIRE(game->game != nullptr);
  state->state = new hanabi_learning_env::HanabiState(
      static_cast<hanabi_learning_env::HanabiGame*>(game->game));
}